

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saxman.h
# Opt level: O3

bool ClownLZSS::Internal::Saxman::CompressWithHeader<ClownLZSS::CompressorOutput<std::ofstream>&>
               (uchar *data,size_t data_size,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2 = std::ostream::tellp();
  std::ostream::put((char)(output->
                          super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                          ).output);
  std::ostream::put((char)(output->
                          super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                          ).output);
  bVar1 = Compress<std::ofstream>(data,data_size,output);
  if (bVar1) {
    auVar3 = std::ostream::tellp();
    std::ostream::seekp((output->
                        super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                        ).output,auVar2._0_8_,auVar2._8_8_);
    std::ostream::put((char)(output->
                            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            ).output);
    std::ostream::put((char)(output->
                            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            ).output);
    std::ostream::seekp((output->
                        super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                        ).output,auVar3._0_8_,auVar3._8_8_);
  }
  return bVar1;
}

Assistant:

inline bool CompressWithHeader(const unsigned char* const data, const std::size_t data_size, T &&output)
			{
				// Track the location of the header...
				const auto header_position = output.Tell();

				// ...and insert a placeholder there.
				output.WriteLE16(0);

				if (!Compress(data, data_size, output))
					return false;

				// Grab the current position for later.
				const auto end_position = output.Tell();

				// Rewind to the header...
				output.Seek(header_position);

				// ...and complete it.
				output.WriteLE16(end_position - header_position - 2);

				// Seek back to the end of the file just as the caller might expect us to do.
				output.Seek(end_position);

				return true;
			}